

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *aabb,char *label,ImGuiDataType data_type,void *data_ptr,ImGuiID id,
               int decimal_precision)

{
  ImGuiContext *pIVar1;
  iterator initial_value_buf;
  ImVec2 local_74;
  byte local_69;
  char local_68 [7];
  bool text_value_changed;
  char buf [32];
  ImGuiWindow *window;
  ImGuiContext *g;
  int decimal_precision_local;
  ImGuiID id_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *label_local;
  ImRect *aabb_local;
  
  pIVar1 = GImGui;
  buf._24_8_ = GetCurrentWindow();
  SetActiveID(pIVar1->ScalarAsInputTextId,(ImGuiWindow *)buf._24_8_);
  SetHoveredID(0);
  FocusableItemUnregister((ImGuiWindow *)buf._24_8_);
  DataTypeFormatString(data_type,data_ptr,decimal_precision,local_68,0x20);
  local_74 = ImRect::GetSize(aabb);
  local_69 = InputTextEx(label,local_68,0x20,&local_74,0x11,(ImGuiTextEditCallback)0x0,(void *)0x0);
  if (pIVar1->ScalarAsInputTextId == 0) {
    if (pIVar1->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x18cd,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, const char *, ImGuiDataType, void *, ImGuiID, int)"
                   );
    }
    pIVar1->ScalarAsInputTextId = pIVar1->ActiveId;
    SetHoveredID(id);
  }
  else if (pIVar1->ActiveId != pIVar1->ScalarAsInputTextId) {
    pIVar1->ScalarAsInputTextId = 0;
  }
  if ((local_69 & 1) == 0) {
    aabb_local._7_1_ = false;
  }
  else {
    initial_value_buf = ImVector<char>::begin(&(GImGui->InputTextState).InitialText);
    aabb_local._7_1_ =
         DataTypeApplyOpFromText(local_68,initial_value_buf,data_type,data_ptr,(char *)0x0);
  }
  return aabb_local._7_1_;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& aabb, const char* label, ImGuiDataType data_type, void* data_ptr, ImGuiID id, int decimal_precision)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    SetActiveID(g.ScalarAsInputTextId, window);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char buf[32];
    DataTypeFormatString(data_type, data_ptr, decimal_precision, buf, IM_ARRAYSIZE(buf));
    bool text_value_changed = InputTextEx(label, buf, IM_ARRAYSIZE(buf), aabb.GetSize(), ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_AutoSelectAll);
    if (g.ScalarAsInputTextId == 0)
    {
        // First frame
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID (else we'd need to store them both, which is also possible)
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    else if (g.ActiveId != g.ScalarAsInputTextId)
    {
        // Release
        g.ScalarAsInputTextId = 0;
    }
    if (text_value_changed)
        return DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}